

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_filter.hpp
# Opt level: O2

void MeanField::Filtering::applyGaussianKernel
               (float *kernel,float *input,float *output,float sd,int dim,int x,int y,int W,int H)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  float *pfVar14;
  ulong uVar15;
  float *pfVar16;
  int j;
  float fVar17;
  
  uVar15 = 0;
  uVar13 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar13 = (ulong)(uint)dim << 2;
  }
  uVar7 = 0;
  if (0 < dim) {
    uVar7 = (ulong)(uint)dim;
  }
  pvVar4 = operator_new__(uVar13);
  for (; uVar7 != uVar15; uVar15 = uVar15 + 1) {
    *(undefined4 *)((long)pvVar4 + uVar15 * 4) = 0;
  }
  iVar5 = (int)sd;
  lVar10 = (long)-iVar5;
  lVar8 = (long)dim;
  lVar9 = (long)W;
  iVar3 = -iVar5;
  if (0 < iVar5) {
    iVar3 = iVar5;
  }
  pfVar16 = input + ((y + lVar10) * lVar9 + (long)x + lVar10) * lVar8;
  fVar17 = 0.0;
  for (lVar6 = lVar10; lVar6 != iVar3; lVar6 = lVar6 + 1) {
    lVar11 = lVar6 + y;
    if (lVar11 < H && -1 < lVar11) {
      pfVar14 = pfVar16;
      for (lVar11 = lVar10; lVar11 != iVar3; lVar11 = lVar11 + 1) {
        lVar12 = lVar11 + x;
        if (lVar12 < lVar9 && -1 < lVar12) {
          fVar1 = kernel[(int)ABS((float)(int)lVar6)];
          fVar2 = kernel[(int)ABS((float)(int)lVar11)];
          for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
            *(float *)((long)pvVar4 + uVar13 * 4) =
                 pfVar14[uVar13] * fVar1 * fVar2 + *(float *)((long)pvVar4 + uVar13 * 4);
          }
          fVar17 = fVar17 + fVar1 * fVar2;
        }
        pfVar14 = pfVar14 + lVar8;
      }
    }
    pfVar16 = pfVar16 + lVar9 * lVar8;
  }
  if (0.0 < fVar17) {
    for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
      output[(long)((W * y + x) * dim) + uVar13] = *(float *)((long)pvVar4 + uVar13 * 4) / fVar17;
    }
  }
  operator_delete__(pvVar4);
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyGaussianKernel(const float *kernel, const float *input, float *output,
                float sd, int dim, int x, int y, int W, int H) {
            float normaliser = 0.0;
            float factor;
            float *channelSum = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSum[i] = 0.0;
            }

            int sd_int = (int)sd;
            int idx_x, idx_y;
            //Convolve for each channel.
            for (int i = -sd_int; i < sd_int; i++) {
                idx_y = y + i;
                if (idx_y < 0 || idx_y >= H) {
                    continue;
                }

                for (int j = -sd_int; j < sd_int; j++) {
                    idx_x = x + j;
                    if (idx_x < 0 || idx_x >= W) {
                        continue;
                    }
                    factor = kernel[(int)fabs((float)i)] * kernel[(int)fabs((float)j)];
                    normaliser += factor;

                    //Update cumulative output for each dimension/channel.
                    for (int k = 0; k < dim; k++) {
                        channelSum[k] += input[(idx_y*W + idx_x)*dim + k] * factor;
                    }
                }
            }

            //Normalise outputs.
            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSum[i] / normaliser;
                }
            }
            delete[] channelSum;
        }